

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdg-datastore.cc
# Opt level: O0

uint32_t detect_read_size(string *read_filename)

{
  bool bVar1;
  value_type vVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> _Var6
  ;
  reference puVar7;
  uint32_t j;
  uint32_t i_1;
  uint32_t i;
  FastqReader<FastqRecord> fastqReader;
  FastqRecord rec;
  vector<unsigned_int,_std::allocator<unsigned_int>_> read_sizes;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  uint32_t uVar8;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe18;
  value_type in_stack_fffffffffffffe1c;
  undefined2 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe22;
  undefined1 in_stack_fffffffffffffe23;
  bool bVar9;
  undefined4 in_stack_fffffffffffffe24;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_1b0;
  uint local_1a8;
  uint local_1a4;
  uint local_1a0;
  undefined4 local_19c;
  string *in_stack_fffffffffffffeb0;
  FastqReader<FastqRecord> *in_stack_fffffffffffffeb8;
  FastxReaderParams in_stack_fffffffffffffec4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_20;
  
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x128c81);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffe24,
                      CONCAT13(in_stack_fffffffffffffe23,
                               CONCAT12(in_stack_fffffffffffffe22,in_stack_fffffffffffffe20))),
             CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
             (allocator_type *)in_stack_fffffffffffffe10._M_current);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x128ca7);
  FastqRecord::FastqRecord
            ((FastqRecord *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  local_19c = 0;
  FastqReader<FastqRecord>::FastqReader
            (in_stack_fffffffffffffeb8,in_stack_fffffffffffffec4,in_stack_fffffffffffffeb0);
  local_1a0 = 0;
  while( true ) {
    bVar1 = FastqReader<FastqRecord>::next_record
                      ((FastqReader<FastqRecord> *)
                       CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                       (FastqRecord *)in_stack_fffffffffffffe10._M_current);
    bVar9 = false;
    if (bVar1) {
      uVar3 = (ulong)local_1a0;
      sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_20);
      bVar9 = uVar3 < sVar4;
    }
    if (!bVar9) break;
    vVar2 = std::__cxx11::string::size();
    uVar3 = (ulong)local_1a0;
    local_1a0 = local_1a0 + 1;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_20,uVar3);
    *pvVar5 = vVar2;
  }
  local_1a4 = 100;
  while( true ) {
    bVar9 = false;
    if (local_1a4 < 10000) {
      bVar9 = FastqReader<FastqRecord>::next_record
                        ((FastqReader<FastqRecord> *)
                         CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                         (FastqRecord *)in_stack_fffffffffffffe10._M_current);
    }
    if (bVar9 == false) break;
    local_1a8 = rand();
    local_1a8 = local_1a8 % local_1a4;
    if (local_1a8 < 100) {
      in_stack_fffffffffffffe1c = std::__cxx11::string::size();
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&local_20,(ulong)local_1a8);
      *pvVar5 = in_stack_fffffffffffffe1c;
    }
    local_1a4 = local_1a4 + 1;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(in_stack_fffffffffffffdf8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(in_stack_fffffffffffffdf8);
  _Var6._M_current._4_4_ = in_stack_fffffffffffffe1c;
  _Var6._M_current._0_4_ = in_stack_fffffffffffffe18;
  _Var6 = std::
          max_element<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                    (_Var6,in_stack_fffffffffffffe10);
  local_1b0 = _Var6;
  puVar7 = __gnu_cxx::
           __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
           ::operator*(&local_1b0);
  uVar8 = *puVar7;
  FastqReader<FastqRecord>::~FastqReader
            ((FastqReader<FastqRecord> *)CONCAT44(uVar8,in_stack_fffffffffffffe00));
  FastqRecord::~FastqRecord((FastqRecord *)CONCAT44(uVar8,in_stack_fffffffffffffe00));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)_Var6._M_current);
  return uVar8;
}

Assistant:

uint32_t detect_read_size(const std::string &read_filename) {
    std::vector<uint32_t> read_sizes(100);

    FastqRecord rec;
    FastqReader<FastqRecord> fastqReader({}, read_filename);
    uint32_t i = 0;
    while(fastqReader.next_record(rec) and i < read_sizes.size()) {
        read_sizes[i++] = rec.seq.size();
    }
    for (uint32_t i = 100; i < 10000 and fastqReader.next_record(rec); i++) {
        uint32_t j = std::rand()%i;
        if (j < 100) {
            read_sizes[j] = rec.seq.size();
        }
    }
    return (*std::max_element(read_sizes.begin(), read_sizes.end()));
}